

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.c
# Opt level: O2

void hex_dump_c(char *addr,size_t len)

{
  byte *pbVar1;
  long lVar2;
  
  pbVar1 = (byte *)(addr + len);
  lVar2 = 0;
  while (addr < pbVar1) {
    if (lVar2 == 0) {
      putchar(0x22);
      lVar2 = 0xe;
    }
    printf("\\x%02x",(ulong)(byte)*addr);
    addr = (char *)((byte *)addr + 1);
    lVar2 = lVar2 + -1;
    if (lVar2 == 0) {
      puts("\"");
    }
  }
  if (lVar2 != 0) {
    puts("\"");
    return;
  }
  return;
}

Assistant:

void
hex_dump_c (const char *addr, size_t len) {
	const char *addr_end = addr + len;
	size_t n = 0;
	while (addr < addr_end) {
		if (n == 0) { printf("\""); n = 14; }
		printf("\\x%02x", *(unsigned char *)addr);
		addr += 1; n -= 1;
		if (n == 0) { printf("\"\n"); }
	}
	if (n != 0) { printf("\"\n"); }
}